

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes,string *targetCompilePdb,string *targetPdb,string *outputConfig,
          WithScanning withScanning)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  cmGlobalNinjaGenerator *pcVar8;
  string *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  undefined7 uVar11;
  undefined7 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  long lVar12;
  bool bVar13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  string_view source;
  string cmdVar;
  string modmapFormat;
  string cudaCompileMode;
  cmList compileCmds;
  string escapedSourceFileName;
  string fullFlags;
  RuleVariables compileObjectVars;
  string local_2e0;
  pointer local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined8 local_2a0;
  string local_298;
  uint local_274;
  string local_270;
  string *local_250;
  string local_248;
  string *local_228;
  undefined8 local_220;
  undefined1 local_218 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  string *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Base_ptr local_1b0 [2];
  _Base_ptr local_1a0 [2];
  _Base_ptr local_190;
  undefined1 local_188 [48];
  pointer local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  _Base_ptr local_f0;
  pointer local_a8;
  pointer local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined7 extraout_var;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_1d8 = objectFileName;
  local_188._0_8_ = local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"EXPORT_COMPILE_COMMANDS","");
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_188);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  if (bVar6) {
    memset(local_188,0,0x158);
    local_158 = (language->_M_dataplus)._M_p;
    local_1d0._M_allocated_capacity = (size_type)&local_1c0;
    pcVar3 = (sourceFileName->_M_dataplus)._M_p;
    local_250 = language;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar3,pcVar3 + sourceFileName->_M_string_length);
    local_190 = (_Base_ptr)sourceFileName;
    bVar6 = cmsys::SystemTools::FileIsFullPath(sourceFileName);
    if (!bVar6) {
      pcVar8 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      psVar9 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((pcVar8->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&local_2e0,(string *)&local_1d0,psVar9);
      std::__cxx11::string::operator=((string *)local_1d0._M_local_buf,(string *)&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
      }
    }
    source._M_str = (char *)local_1d0._M_allocated_capacity;
    source._M_len = local_1d0._8_8_;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_2e0,(cmOutputConverter *)this->LocalGenerator,source,SHELL,false);
    std::__cxx11::string::operator=((string *)local_1d0._M_local_buf,(string *)&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
    }
    local_1b0[0] = (_Base_ptr)local_1a0;
    pcVar3 = (flags->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,pcVar3,pcVar3 + flags->_M_string_length);
    if (withScanning == Yes) {
      local_2e0._M_dataplus._M_p = (pointer)0x6;
      local_2e0._M_string_length = 0x7f5fd1;
      local_2e0.field_2._M_allocated_capacity = 0;
      local_2c0 = (local_250->_M_dataplus)._M_p;
      local_2e0.field_2._8_8_ = local_250->_M_string_length;
      local_2b8 = 0;
      local_2b0 = 0x12;
      local_2a8 = "_MODULE_MAP_FORMAT";
      local_2a0 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&local_2e0;
      cmCatViews(&local_298,views);
      psVar9 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_298);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      pcVar3 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,pcVar3,pcVar3 + psVar9->_M_string_length);
      if (local_270._M_string_length != 0) {
        pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
        local_2e0._M_dataplus._M_p = (pointer)0x6;
        local_2e0._M_string_length = 0x7f5fd1;
        local_2e0.field_2._M_allocated_capacity = 0;
        local_2c0 = (local_250->_M_dataplus)._M_p;
        local_2e0.field_2._8_8_ = local_250->_M_string_length;
        local_2b8 = 0;
        local_2b0 = 0x10;
        local_2a8 = "_MODULE_MAP_FLAG";
        local_2a0 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_2e0;
        cmCatViews(&local_248,views_00);
        psVar9 = cmMakefile::GetRequiredDefinition(pcVar4,&local_248);
        pcVar3 = (psVar9->_M_dataplus)._M_p;
        local_218._0_8_ = (string *)(local_218 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,pcVar3,pcVar3 + psVar9->_M_string_length);
        paVar1 = &local_248.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        local_248._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"<MODULE_MAP_FILE>","")
        ;
        local_2e0._M_string_length = (size_type)(local_1d8->_M_dataplus)._M_p;
        local_2e0._M_dataplus._M_p = (pointer)local_1d8->_M_string_length;
        local_2e0.field_2._M_allocated_capacity = 0;
        local_2e0.field_2._8_8_ = 7;
        local_2c0 = ".modmap";
        local_2b8 = 0;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&local_2e0;
        cmCatViews((string *)&local_1f8,views_01);
        cmsys::SystemTools::ReplaceString((string *)local_218,&local_248,(string *)&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_allocated_capacity != &local_1e8) {
          operator_delete((void *)local_1f8._M_allocated_capacity,
                          local_1e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        local_2e0.field_2._M_allocated_capacity = (long)&local_2e0.field_2 + 8;
        local_2e0._M_dataplus._M_p = (pointer)0x0;
        local_2e0._M_string_length = 1;
        local_2e0.field_2._M_local_buf[8] = 0x20;
        local_248._M_dataplus._M_p = (pointer)0x1;
        local_248.field_2._M_allocated_capacity = 0;
        local_248.field_2._8_8_ = local_218._8_8_;
        local_228 = (string *)local_218._0_8_;
        local_220 = 0;
        views_02._M_len = 2;
        views_02._M_array = (iterator)&local_248;
        local_248._M_string_length = local_2e0.field_2._M_allocated_capacity;
        cmCatViews((string *)&local_1f8,views_02);
        std::__cxx11::string::_M_append((char *)local_1b0,local_1f8._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_allocated_capacity != &local_1e8) {
          operator_delete((void *)local_1f8._M_allocated_capacity,
                          local_1e8._M_allocated_capacity + 1);
        }
        if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                 local_270.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    psVar9 = local_250;
    local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_allocated_capacity;
    local_108 = (local_1d8->_M_dataplus)._M_p;
    local_100 = (objectDir->_M_dataplus)._M_p;
    local_f8 = (objectFileDir->_M_dataplus)._M_p;
    local_f0 = local_1b0[0];
    local_a8 = (defines->_M_dataplus)._M_p;
    local_a0 = (includes->_M_dataplus)._M_p;
    local_188._24_8_ = (targetCompilePdb->_M_dataplus)._M_p;
    local_188._16_8_ = (targetPdb->_M_dataplus)._M_p;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity =
         local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar7 = std::__cxx11::string::compare((char *)local_250);
    paVar1 = &local_2e0.field_2;
    if (iVar7 == 0) {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      local_2e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e0,"CUDA_SEPARABLE_COMPILATION","");
      bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_2e0);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(extraout_var,bVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        paVar10 = extraout_RAX;
      }
      if (bVar6) {
        pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
        local_2e0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"_CMAKE_CUDA_RDC_FLAG","");
        psVar9 = cmMakefile::GetRequiredDefinition(pcVar4,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          (ulong)(local_2e0.field_2._M_allocated_capacity + 1));
        }
        local_2e0._M_dataplus._M_p = (pointer)local_248._M_string_length;
        local_2e0._M_string_length = (size_type)local_248._M_dataplus._M_p;
        local_2e0.field_2._M_allocated_capacity = 0;
        local_2c0 = (psVar9->_M_dataplus)._M_p;
        local_2e0.field_2._8_8_ = psVar9->_M_string_length;
        local_2b8 = 0;
        local_2b0 = 1;
        local_2a8 = " ";
        local_2a0 = 0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)&local_2e0;
        cmCatViews(&local_298,views_03);
        std::__cxx11::string::operator=((string *)&local_248,(string *)&local_298);
        paVar10 = &local_298.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar10) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          paVar10 = extraout_RAX_00;
        }
      }
      uVar11 = (undefined7)((ulong)paVar10 >> 8);
      if (ExportObjectCompileCommand(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
          ::compileModes == '\0') {
        ExportObjectCompileCommand();
        uVar11 = extraout_var_00;
      }
      local_274 = (uint)CONCAT71(uVar11,1);
      lVar12 = 8;
      do {
        sVar5 = *(size_type *)
                 (&WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                   ::compileModes + lVar12);
        pcVar3 = *(pointer *)
                  ((long)&ExportObjectCompileCommand::compileModes._M_elems[0]._M_len + lVar12);
        local_2e0._M_dataplus._M_p = (pointer)0x5;
        local_2e0._M_string_length = 0x7c25c4;
        local_2e0.field_2._M_allocated_capacity = 0;
        local_2b8 = 0;
        local_2b0 = 0xc;
        local_2a8 = "_COMPILATION";
        local_2a0 = 0;
        views_04._M_len = 3;
        views_04._M_array = (iterator)&local_2e0;
        local_2e0.field_2._8_8_ = sVar5;
        local_2c0 = pcVar3;
        cmCatViews(&local_298,views_04);
        local_2e0._M_dataplus._M_p = (pointer)0xc;
        local_2e0._M_string_length = 0x7c25bd;
        local_2e0.field_2._M_allocated_capacity = 0;
        local_2b8 = 0;
        local_2b0 = 5;
        local_2a8 = "_FLAG";
        local_2a0 = 0;
        views_05._M_len = 3;
        views_05._M_array = (iterator)&local_2e0;
        local_2e0.field_2._8_8_ = sVar5;
        local_2c0 = pcVar3;
        cmCatViews(&local_270,views_05);
        bVar6 = cmGeneratorTarget::GetPropertyAsBool
                          ((this->super_cmCommonTargetGenerator).GeneratorTarget,&local_298);
        if (bVar6) {
          psVar9 = cmMakefile::GetRequiredDefinition
                             ((this->super_cmCommonTargetGenerator).Makefile,&local_270);
          local_2e0._M_dataplus._M_p = (pointer)local_248._M_string_length;
          local_2e0._M_string_length = (size_type)local_248._M_dataplus._M_p;
          local_2e0.field_2._M_allocated_capacity = 0;
          local_2c0 = (psVar9->_M_dataplus)._M_p;
          local_2e0.field_2._8_8_ = psVar9->_M_string_length;
          local_2b8 = 0;
          views_06._M_len = 2;
          views_06._M_array = (iterator)&local_2e0;
          cmCatViews((string *)local_218,views_06);
          std::__cxx11::string::operator=((string *)&local_248,(string *)local_218);
          if ((string *)local_218._0_8_ != (string *)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          local_274 = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        bVar13 = lVar12 != 0x38;
        lVar12 = lVar12 + 0x10;
      } while (!bVar6 && bVar13);
      if ((local_274 & 1) != 0) {
        pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e0,"_CMAKE_CUDA_WHOLE_FLAG","");
        psVar9 = cmMakefile::GetRequiredDefinition(pcVar4,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        local_2e0._M_dataplus._M_p = (pointer)local_248._M_string_length;
        local_2e0._M_string_length = (size_type)local_248._M_dataplus._M_p;
        local_2e0.field_2._M_allocated_capacity = 0;
        local_2c0 = (psVar9->_M_dataplus)._M_p;
        local_2e0.field_2._8_8_ = psVar9->_M_string_length;
        local_2b8 = 0;
        views_07._M_len = 2;
        views_07._M_array = (iterator)&local_2e0;
        cmCatViews(&local_298,views_07);
        std::__cxx11::string::operator=((string *)&local_248,(string *)&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_248._M_dataplus._M_p;
      psVar9 = local_250;
    }
    local_2e0._M_dataplus._M_p = (pointer)0x6;
    local_2e0._M_string_length = 0x7f5fd1;
    local_2e0.field_2._M_allocated_capacity = 0;
    local_2c0 = (psVar9->_M_dataplus)._M_p;
    local_2e0.field_2._8_8_ = psVar9->_M_string_length;
    local_2b8 = 0;
    local_2b0 = 0xf;
    local_2a8 = "_COMPILE_OBJECT";
    local_2a0 = 0;
    views_08._M_len = 3;
    views_08._M_array = (iterator)&local_2e0;
    cmCatViews(&local_298,views_08);
    psVar9 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&local_298);
    cmList::cmList((cmList *)local_218,psVar9,Yes,No);
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_1f8);
    if (local_218._0_8_ != local_218._8_8_) {
      psVar9 = (string *)local_218._0_8_;
      do {
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)local_1f8._M_allocated_capacity,
                   (cmOutputConverter *)this->LocalGenerator,psVar9,(RuleVariables *)local_188);
        psVar9 = psVar9 + 1;
      } while (psVar9 != (string *)local_218._8_8_);
    }
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_2e0,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218,outputConfig,outputConfig,&local_270,(cmGeneratorTarget *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                               local_270.field_2._M_local_buf[0]) + 1);
    }
    pcVar8 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar8,&local_2e0,(string *)local_190,local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_1f8._M_allocated_capacity + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_1b0[0] != (_Base_ptr)local_1a0) {
      operator_delete(local_1b0[0],(ulong)((long)&local_1a0[0]->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_allocated_capacity != &local_1c0) {
      operator_delete((void *)local_1d0._M_allocated_capacity,local_1c0._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes,
  std::string const& targetCompilePdb, std::string const& targetPdb,
  std::string const& outputConfig, WithScanning withScanning)
{
  if (!this->GeneratorTarget->GetPropertyAsBool("EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    escapedSourceFileName =
      cmSystemTools::CollapseFullPath(escapedSourceFileName,
                                      this->GetGlobalGenerator()
                                        ->GetCMakeInstance()
                                        ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  std::string fullFlags = flags;
  if (withScanning == WithScanning::Yes) {
    std::string const modmapFormatVar =
      cmStrCat("CMAKE_", language, "_MODULE_MAP_FORMAT");
    std::string const modmapFormat =
      this->Makefile->GetSafeDefinition(modmapFormatVar);
    if (!modmapFormat.empty()) {
      std::string modmapFlags = this->GetMakefile()->GetRequiredDefinition(
        cmStrCat("CMAKE_", language, "_MODULE_MAP_FLAG"));
      // XXX(modmap): If changing this path construction, change
      // `cmGlobalNinjaGenerator::WriteDyndep` and
      // `cmNinjaTargetGenerator::WriteObjectBuildStatement` to expect the
      // corresponding file path.
      cmSystemTools::ReplaceString(modmapFlags, "<MODULE_MAP_FILE>",
                                   cmStrCat(objectFileName, ".modmap"));
      fullFlags += cmStrCat(' ', modmapFlags);
    }
  }

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = fullFlags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();
  compileObjectVars.TargetCompilePDB = targetCompilePdb.c_str();
  compileObjectVars.TargetPDB = targetPdb.c_str();

  // Rule for compiling object file.
  std::string cudaCompileMode;
  if (language == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    static std::array<cm::string_view, 4> const compileModes{
      { "PTX"_s, "CUBIN"_s, "FATBIN"_s, "OPTIX"_s }
    };
    bool useNormalCompileMode = true;
    for (cm::string_view mode : compileModes) {
      auto propName = cmStrCat("CUDA_", mode, "_COMPILATION");
      auto defName = cmStrCat("_CMAKE_CUDA_", mode, "_FLAG");
      if (this->GeneratorTarget->GetPropertyAsBool(propName)) {
        const std::string& flag =
          this->Makefile->GetRequiredDefinition(defName);
        cudaCompileMode = cmStrCat(cudaCompileMode, flag);
        useNormalCompileMode = false;
        break;
      }
    }
    if (useNormalCompileMode) {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    compileObjectVars.CudaCompileMode = cudaCompileMode.c_str();
  }

  const std::string cmdVar = cmStrCat("CMAKE_", language, "_COMPILE_OBJECT");
  const std::string& compileCmd =
    this->Makefile->GetRequiredDefinition(cmdVar);
  cmList compileCmds(compileCmd);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  for (auto& i : compileCmds) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 compileObjectVars);
  }

  std::string cmdLine = this->GetLocalGenerator()->BuildCommandLine(
    compileCmds, outputConfig, outputConfig);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName,
                                                   objectFileName);
}